

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_read_f32__pcm(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  ushort uVar1;
  drwav_uint64 sampleCount;
  short sVar2;
  uint shift;
  ulong uVar3;
  uchar *puVar4;
  float *pfVar5;
  drwav_uint64 sample;
  ulong uVar6;
  uint j;
  ulong uVar7;
  drwav_uint64 dVar8;
  uchar sampleData [4096];
  
  if (pWav->bytesPerSample == 0) {
    dVar8 = 0;
  }
  else {
    dVar8 = 0;
    for (; samplesToRead != 0; samplesToRead = samplesToRead - sampleCount) {
      uVar3 = (ulong)(0x1000 / pWav->bytesPerSample);
      if (samplesToRead < uVar3) {
        uVar3 = samplesToRead;
      }
      sampleCount = drwav_read(pWav,uVar3,sampleData);
      if (sampleCount == 0) {
        return dVar8;
      }
      uVar1 = pWav->bytesPerSample;
      switch(uVar1) {
      case 1:
        drwav_u8_to_f32(pBufferOut,sampleData,sampleCount);
        break;
      case 2:
        drwav_s16_to_f32(pBufferOut,(drwav_int16 *)sampleData,sampleCount);
        break;
      case 3:
        drwav_s24_to_f32(pBufferOut,sampleData,sampleCount);
        break;
      case 4:
        drwav_s32_to_f32(pBufferOut,(drwav_int32 *)sampleData,sampleCount);
        break;
      default:
        if (uVar1 < 9) {
          puVar4 = sampleData;
          pfVar5 = pBufferOut;
          for (uVar3 = 0; uVar3 < sampleCount; uVar3 = (ulong)((int)uVar3 + 1)) {
            uVar6 = 0;
            sVar2 = uVar1 * -8 + 0x40;
            for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
              uVar6 = uVar6 | (ulong)puVar4[uVar7] << ((byte)sVar2 & 0x3f);
              sVar2 = sVar2 + 8;
            }
            puVar4 = puVar4 + uVar1;
            *pfVar5 = (float)((double)(long)uVar6 * 1.0842021724855044e-19);
            pfVar5 = pfVar5 + 1;
          }
        }
        else {
          memset(pBufferOut,0,sampleCount * 4);
        }
      }
      pBufferOut = pBufferOut + sampleCount;
      dVar8 = dVar8 + sampleCount;
    }
  }
  return dVar8;
}

Assistant:

drwav_uint64 drwav_read_f32__pcm(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut) {
    if (pWav->bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__pcm_to_f32(pBufferOut, sampleData, (size_t)samplesRead, pWav->bytesPerSample);
        pBufferOut += samplesRead;

        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}